

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigation.cpp
# Opt level: O2

ScenarioUpperBound * __thiscall
despot::Navigation::CreateScenarioUpperBound
          (Navigation *this,string *name,string *particle_bound_name)

{
  bool bVar1;
  TrivialParticleUpperBound *this_00;
  MDPUpperBound *this_01;
  LookaheadUpperBound *this_02;
  ParticleUpperBound *pPVar2;
  ostream *poVar3;
  string asStack_38 [32];
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if ((bVar1) || (bVar1 = std::operator==(name,"DEFAULT"), bVar1)) {
    this_00 = (TrivialParticleUpperBound *)operator_new(0x10);
    despot::TrivialParticleUpperBound::TrivialParticleUpperBound(this_00,&this->super_DSPOMDP);
    return (ScenarioUpperBound *)this_00;
  }
  bVar1 = std::operator==(name,"MDP");
  if (bVar1) {
    this_01 = (MDPUpperBound *)operator_new(0x38);
    despot::MDPUpperBound::MDPUpperBound(this_01,&this->super_MDP,&this->super_StateIndexer);
    return (ScenarioUpperBound *)this_01;
  }
  bVar1 = std::operator==(name,"LOOKAHEAD");
  if (bVar1) {
    this_02 = (LookaheadUpperBound *)operator_new(0x38);
    std::__cxx11::string::string(asStack_38,(string *)particle_bound_name);
    pPVar2 = (ParticleUpperBound *)(**(code **)(*(long *)this + 0x60))(this,asStack_38);
    despot::LookaheadUpperBound::LookaheadUpperBound
              (this_02,&this->super_DSPOMDP,&this->super_StateIndexer,pPVar2);
    std::__cxx11::string::~string(asStack_38);
    return (ScenarioUpperBound *)this_02;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Unsupported scenario upper bound: ");
  poVar3 = std::operator<<(poVar3,(string *)name);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

ScenarioUpperBound* Navigation::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	if (name == "TRIVIAL" || name == "DEFAULT") {
		return new TrivialParticleUpperBound(this);
	} else if (name == "MDP") {
		return new MDPUpperBound(this, *this);
	} else if (name == "LOOKAHEAD") {
		return new LookaheadUpperBound(this, *this,
			CreateParticleUpperBound(particle_bound_name));
	} else {
		cerr << "Unsupported scenario upper bound: " << name << endl;
		exit(1);
		return NULL;
	}
}